

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::GUIDTest_test_new_guid_differ_Test::TestBody
          (GUIDTest_test_new_guid_differ_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_270;
  Message local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  Message local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e8;
  Message local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  GUID guid5;
  GUID local_78 [8];
  GUID guid4;
  GUID local_68 [8];
  GUID guid3;
  GUID local_58 [8];
  GUID guid2;
  GUID local_38 [8];
  GUID guid1;
  GUID local_28 [8];
  GUID guid0;
  int local_14;
  int it;
  GUIDTest_test_new_guid_differ_Test *this_local;
  
  local_14 = 0;
  while( true ) {
    if (999 < local_14) {
      return;
    }
    bidfx_public_api::tools::GUID::GUID(local_28);
    bidfx_public_api::tools::GUID::GUID(local_38);
    bidfx_public_api::tools::GUID::GUID(local_58);
    bidfx_public_api::tools::GUID::GUID(local_68);
    bidfx_public_api::tools::GUID::GUID(local_78);
    bidfx_public_api::tools::GUID::GUID((GUID *)&gtest_ar.message_);
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_98,"guid0.ToString()","guid1.ToString()",&local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                 ,0x21,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)local_100,"guid0.ToString()","guid2.ToString()",&local_120,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x22,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_148);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
        bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
        testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)local_160,"guid0.ToString()","guid3.ToString()",&local_180,&local_1a0
                  );
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_180);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_1a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                     ,0x23,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_1a8);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
          bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
          testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)local_1c0,"guid0.ToString()","guid4.ToString()",&local_1e0,
                     &local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_1e0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar1) {
            testing::Message::Message(&local_208);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                       ,0x24,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_208);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_208);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
            bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
            testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                      ((internal *)local_220,"guid0.ToString()","guid5.ToString()",&local_240,
                       &local_260);
            std::__cxx11::string::~string((string *)&local_260);
            std::__cxx11::string::~string((string *)&local_240);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
            if (!bVar1) {
              testing::Message::Message(&local_268);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
              testing::internal::AssertHelper::AssertHelper
                        (&local_270,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                         ,0x25,pcVar2);
              testing::internal::AssertHelper::operator=(&local_270,&local_268);
              testing::internal::AssertHelper::~AssertHelper(&local_270);
              testing::Message::~Message(&local_268);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              gtest_ar_1.message_.ptr_._4_4_ = 0;
            }
          }
        }
      }
    }
    bidfx_public_api::tools::GUID::~GUID((GUID *)&gtest_ar.message_);
    bidfx_public_api::tools::GUID::~GUID(local_78);
    bidfx_public_api::tools::GUID::~GUID(local_68);
    bidfx_public_api::tools::GUID::~GUID(local_58);
    bidfx_public_api::tools::GUID::~GUID(local_38);
    bidfx_public_api::tools::GUID::~GUID(local_28);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

TEST_F(GUIDTest, test_new_guid_differ)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid0;
        GUID guid1;
        GUID guid2;
        GUID guid3;
        GUID guid4;
        GUID guid5;
        ASSERT_NE(guid0.ToString(), guid1.ToString());
        ASSERT_NE(guid0.ToString(), guid2.ToString());
        ASSERT_NE(guid0.ToString(), guid3.ToString());
        ASSERT_NE(guid0.ToString(), guid4.ToString());
        ASSERT_NE(guid0.ToString(), guid5.ToString());
    }
}